

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

int envy_bios_parse_power_budget(envy_bios *bios)

{
  uint8_t uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint32_t uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  envy_bios_power_budget *peVar10;
  envy_bios_power_budget_entry *peVar11;
  uint local_28;
  uint32_t data;
  int err;
  int i;
  envy_bios_power_budget *budget;
  envy_bios *bios_local;
  
  peVar10 = &(bios->power).budget;
  if (peVar10->offset == 0) {
    bios_local._4_4_ = -0x16;
  }
  else {
    bios_u8(bios,peVar10->offset,&(bios->power).budget.version);
    uVar1 = (bios->power).budget.version;
    if (((uVar1 == '\x10') || (uVar1 == ' ')) || (uVar1 == '0')) {
      iVar2 = bios_u8(bios,peVar10->offset + 1,&(bios->power).budget.hlen);
      iVar3 = bios_u8(bios,peVar10->offset + 2,&(bios->power).budget.rlen);
      iVar4 = bios_u8(bios,peVar10->offset + 3,&(bios->power).budget.entriesnum);
      (bios->power).budget.valid = ((iVar4 != 0 || (iVar3 != 0 || iVar2 != 0)) ^ 0xffU) & 1;
      uVar1 = (bios->power).budget.version;
      if (uVar1 == ' ') {
        bios_u8(bios,peVar10->offset + 9,&(bios->power).budget.cap_entry);
      }
      else if (uVar1 == '0') {
        bios_u8(bios,peVar10->offset + 10,&(bios->power).budget.cap_entry);
      }
      local_28 = 0;
      peVar11 = (envy_bios_power_budget_entry *)
                malloc((ulong)(bios->power).budget.entriesnum * 0x18);
      (bios->power).budget.entries = peVar11;
      memset((bios->power).budget.entries,0,(ulong)(bios->power).budget.entriesnum * 0x18);
      for (data = 0; (int)data < (int)(uint)(bios->power).budget.entriesnum; data = data + 1) {
        uVar5 = peVar10->offset + (uint)(bios->power).budget.hlen + data * (bios->power).budget.rlen
        ;
        (bios->power).budget.entries[(int)data].offset = uVar5;
        if ((bios->power).budget.rlen == '\x06') {
          uVar6 = bios_u32(bios,uVar5 + 2,&(bios->power).budget.entries[(int)data].avg);
          local_28 = uVar6 | local_28;
        }
        else {
          uVar6 = bios_u32(bios,uVar5 + 2,&(bios->power).budget.entries[(int)data].min);
          uVar7 = bios_u32(bios,uVar5 + 6,&(bios->power).budget.entries[(int)data].avg);
          uVar8 = bios_u32(bios,uVar5 + 10,&(bios->power).budget.entries[(int)data].peak);
          uVar9 = bios_u32(bios,uVar5 + 0x12,&(bios->power).budget.entries[(int)data].unkn12);
          local_28 = uVar9 | uVar8 | uVar7 | uVar6 | local_28;
        }
        (bios->power).budget.entries[(int)data].valid = (local_28 != 0 ^ 0xffU) & 1;
      }
      bios_local._4_4_ = 0;
    }
    else {
      fprintf(_stderr,"Unknown POWER BUDGET table version 0x%x\n",
              (ulong)(bios->power).budget.version);
      bios_local._4_4_ = -0x16;
    }
  }
  return bios_local._4_4_;
}

Assistant:

int envy_bios_parse_power_budget(struct envy_bios *bios) {
	struct envy_bios_power_budget *budget = &bios->power.budget;
	int i, err = 0;

	if (!budget->offset)
		return -EINVAL;

	bios_u8(bios, budget->offset + 0x0, &budget->version);

	switch(budget->version) {
	case 0x10:
	case 0x20:
	case 0x30:
		err |= bios_u8(bios, budget->offset + 0x1, &budget->hlen);
		err |= bios_u8(bios, budget->offset + 0x2, &budget->rlen);
		err |= bios_u8(bios, budget->offset + 0x3, &budget->entriesnum);
		budget->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown POWER BUDGET table version 0x%x\n", budget->version);
		return -EINVAL;
	};

	switch(budget->version) {
	case 0x20:
		err |= bios_u8(bios, budget->offset + 0x9, &budget->cap_entry);
		break;
	case 0x30:
		err |= bios_u8(bios, budget->offset + 0xa, &budget->cap_entry);
		break;
	};

	err = 0;
	budget->entries = malloc(budget->entriesnum * sizeof(struct envy_bios_power_budget_entry));
	memset(budget->entries, 0x0, budget->entriesnum * sizeof(struct envy_bios_power_budget_entry));
	for (i = 0; i < budget->entriesnum; i++) {
		uint32_t data = budget->offset + budget->hlen + i * budget->rlen;

		budget->entries[i].offset = data;

		if (budget->rlen == 0x6) {
			err |= bios_u32(bios, data + 0x02, &budget->entries[i].avg);
		} else {
			err |= bios_u32(bios, data + 0x02, &budget->entries[i].min);
			err |= bios_u32(bios, data + 0x06, &budget->entries[i].avg);
			err |= bios_u32(bios, data + 0x0a, &budget->entries[i].peak);
			err |= bios_u32(bios, data + 0x12, &budget->entries[i].unkn12);
		}

		budget->entries[i].valid = !err;
	}

	return 0;
}